

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O2

void store_vertical_filter_output
               (__m128i *res_lo,__m128i *res_hi,__m128i *res_add_const,__m128i *wt,
               __m128i *res_sub_const,__m128i *round_bits_const,uint8_t *pred,
               ConvolveParams *conv_params,int i,int j,int k,int reduce_bits_vert,int p_stride,
               int p_width,int round_bits)

{
  ulong uVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  short sVar35;
  short sVar36;
  short sVar37;
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  iVar12 = (int)(*res_lo)[0];
  iVar3 = *(int *)((long)*res_lo + 4);
  iVar4 = (int)(*res_lo)[1];
  iVar5 = *(int *)((long)*res_lo + 0xc);
  iVar6 = (int)(*res_hi)[0];
  iVar7 = *(int *)((long)*res_hi + 4);
  iVar8 = (int)(*res_hi)[1];
  iVar9 = *(int *)((long)*res_hi + 0xc);
  if (conv_params->is_compound == 0) {
    iVar14 = (int)(*res_add_const)[0];
    iVar15 = *(int *)((long)*res_add_const + 4);
    iVar10 = (int)(*res_add_const)[1];
    iVar11 = *(int *)((long)*res_add_const + 0xc);
    auVar28 = ZEXT416((uint)reduce_bits_vert);
    auVar27._0_4_ = iVar12 + iVar14 >> auVar28;
    auVar27._4_4_ = iVar3 + iVar15 >> auVar28;
    auVar27._8_4_ = iVar4 + iVar10 >> auVar28;
    auVar27._12_4_ = iVar5 + iVar11 >> auVar28;
    auVar19._0_4_ = iVar6 + iVar14 >> auVar28;
    auVar19._4_4_ = iVar7 + iVar15 >> auVar28;
    auVar19._8_4_ = iVar8 + iVar10 >> auVar28;
    auVar19._12_4_ = iVar9 + iVar11 >> auVar28;
    auVar19 = packssdw(auVar27,auVar19);
    sVar35 = auVar19._0_2_;
    sVar36 = auVar19._2_2_;
    sVar37 = auVar19._4_2_;
    sVar2 = auVar19._6_2_;
    uVar18 = CONCAT13((0 < sVar2) * (sVar2 < 0x100) * auVar19[6] - (0xff < sVar2),
                      CONCAT12((0 < sVar37) * (sVar37 < 0x100) * auVar19[4] - (0xff < sVar37),
                               CONCAT11((0 < sVar36) * (sVar36 < 0x100) * auVar19[2] -
                                        (0xff < sVar36),
                                        (0 < sVar35) * (sVar35 < 0x100) * auVar19[0] -
                                        (0xff < sVar35))));
    sVar35 = auVar19._8_2_;
    sVar36 = auVar19._10_2_;
    sVar37 = auVar19._12_2_;
    sVar2 = auVar19._14_2_;
    iVar12 = (k + i + 4) * p_stride + j;
    if (p_width == 4) {
      *(undefined4 *)(pred + iVar12) = uVar18;
    }
    else {
      *(ulong *)(pred + iVar12) =
           CONCAT17((0 < sVar2) * (sVar2 < 0x100) * auVar19[0xe] - (0xff < sVar2),
                    CONCAT16((0 < sVar37) * (sVar37 < 0x100) * auVar19[0xc] - (0xff < sVar37),
                             CONCAT15((0 < sVar36) * (sVar36 < 0x100) * auVar19[10] -
                                      (0xff < sVar36),
                                      CONCAT14((0 < sVar35) * (sVar35 < 0x100) * auVar19[8] -
                                               (0xff < sVar35),uVar18))));
    }
  }
  else {
    iVar14 = k + i + 4;
    iVar15 = conv_params->dst_stride * iVar14 + j;
    auVar27 = ZEXT416((uint)reduce_bits_vert);
    auVar28._0_4_ = iVar12 + (int)(*res_add_const)[0] >> auVar27;
    auVar28._4_4_ = iVar3 + *(int *)((long)*res_add_const + 4) >> auVar27;
    auVar28._8_4_ = iVar4 + (int)(*res_add_const)[1] >> auVar27;
    auVar28._12_4_ = iVar5 + *(int *)((long)*res_add_const + 0xc) >> auVar27;
    auVar19 = packusdw(auVar28,auVar28);
    if (conv_params->do_average == 0) {
      *(long *)(conv_params->dst + iVar15) = auVar19._0_8_;
    }
    else {
      uVar1 = *(ulong *)(conv_params->dst + iVar15);
      sVar37 = (short)(uVar1 >> 0x30);
      sVar36 = (short)(uVar1 >> 0x20);
      auVar29._0_2_ = (short)uVar1;
      sVar35 = (short)(uVar1 >> 0x10);
      if (conv_params->use_dist_wtd_comp_avg == 0) {
        auVar20._0_2_ = auVar19._0_2_ + auVar29._0_2_;
        auVar20._2_2_ = auVar19._2_2_ + sVar35;
        auVar20._4_2_ = auVar19._4_2_ + sVar36;
        auVar20._6_2_ = auVar19._6_2_ + sVar37;
        auVar20._8_2_ = auVar19._8_2_;
        auVar20._10_2_ = auVar19._10_2_;
        auVar20._12_2_ = auVar19._12_2_;
        auVar20._14_2_ = auVar19._14_2_;
        auVar19 = psraw(auVar20,1);
      }
      else {
        auVar32._8_4_ = 0;
        auVar32._0_8_ = uVar1;
        auVar32._12_2_ = sVar37;
        auVar32._14_2_ = auVar19._6_2_;
        auVar31._12_4_ = auVar32._12_4_;
        auVar31._8_2_ = 0;
        auVar31._0_8_ = uVar1;
        auVar31._10_2_ = auVar19._4_2_;
        auVar30._10_6_ = auVar31._10_6_;
        auVar30._8_2_ = sVar36;
        auVar30._0_8_ = uVar1;
        auVar29._8_8_ = auVar30._8_8_;
        auVar29._6_2_ = auVar19._2_2_;
        auVar29._4_2_ = sVar35;
        auVar29._2_2_ = auVar19._0_2_;
        auVar19 = pmaddwd(auVar29,(undefined1  [16])*wt);
        auVar33._0_4_ = auVar19._0_4_ >> 4;
        auVar33._4_4_ = auVar19._4_4_ >> 4;
        auVar33._8_4_ = auVar19._8_4_ >> 4;
        auVar33._12_4_ = auVar19._12_4_ >> 4;
        auVar19 = packusdw(auVar33,auVar33);
      }
      auVar34._0_2_ = auVar19._0_2_ + (short)(*res_sub_const)[0] + (short)(*round_bits_const)[0];
      auVar34._2_2_ =
           auVar19._2_2_ + *(short *)((long)*res_sub_const + 2) +
           *(short *)((long)*round_bits_const + 2);
      auVar34._4_2_ =
           auVar19._4_2_ + *(short *)((long)*res_sub_const + 4) +
           *(short *)((long)*round_bits_const + 4);
      auVar34._6_2_ =
           auVar19._6_2_ + *(short *)((long)*res_sub_const + 6) +
           *(short *)((long)*round_bits_const + 6);
      auVar34._8_2_ = auVar19._8_2_ + (short)(*res_sub_const)[1] + (short)(*round_bits_const)[1];
      auVar34._10_2_ =
           auVar19._10_2_ + *(short *)((long)*res_sub_const + 10) +
           *(short *)((long)*round_bits_const + 10);
      auVar34._12_2_ =
           auVar19._12_2_ + *(short *)((long)*res_sub_const + 0xc) +
           *(short *)((long)*round_bits_const + 0xc);
      auVar34._14_2_ =
           auVar19._14_2_ + *(short *)((long)*res_sub_const + 0xe) +
           *(short *)((long)*round_bits_const + 0xe);
      auVar19 = psraw(auVar34,ZEXT416((uint)round_bits));
      sVar35 = auVar19._0_2_;
      sVar36 = auVar19._2_2_;
      sVar37 = auVar19._4_2_;
      sVar2 = auVar19._6_2_;
      *(uint *)(pred + (iVar14 * p_stride + j)) =
           CONCAT13((0 < sVar2) * (sVar2 < 0x100) * auVar19[6] - (0xff < sVar2),
                    CONCAT12((0 < sVar37) * (sVar37 < 0x100) * auVar19[4] - (0xff < sVar37),
                             CONCAT11((0 < sVar36) * (sVar36 < 0x100) * auVar19[2] - (0xff < sVar36)
                                      ,(0 < sVar35) * (sVar35 < 0x100) * auVar19[0] -
                                       (0xff < sVar35))));
    }
    if (4 < p_width) {
      auVar16._0_4_ = iVar6 + (int)(*res_add_const)[0] >> auVar27;
      auVar16._4_4_ = iVar7 + *(int *)((long)*res_add_const + 4) >> auVar27;
      auVar16._8_4_ = iVar8 + (int)(*res_add_const)[1] >> auVar27;
      auVar16._12_4_ = iVar9 + *(int *)((long)*res_add_const + 0xc) >> auVar27;
      lVar13 = (long)(conv_params->dst_stride * iVar14 + j);
      auVar19 = packusdw(auVar16,auVar16);
      if (conv_params->do_average == 0) {
        *(long *)(conv_params->dst + lVar13 + 4) = auVar19._0_8_;
      }
      else {
        uVar1 = *(ulong *)(conv_params->dst + lVar13 + 4);
        sVar37 = (short)(uVar1 >> 0x30);
        sVar36 = (short)(uVar1 >> 0x20);
        auVar21._0_2_ = (short)uVar1;
        sVar35 = (short)(uVar1 >> 0x10);
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          auVar17._0_2_ = auVar19._0_2_ + auVar21._0_2_;
          auVar17._2_2_ = auVar19._2_2_ + sVar35;
          auVar17._4_2_ = auVar19._4_2_ + sVar36;
          auVar17._6_2_ = auVar19._6_2_ + sVar37;
          auVar17._8_2_ = auVar19._8_2_;
          auVar17._10_2_ = auVar19._10_2_;
          auVar17._12_2_ = auVar19._12_2_;
          auVar17._14_2_ = auVar19._14_2_;
          auVar19 = psraw(auVar17,1);
        }
        else {
          auVar24._8_4_ = 0;
          auVar24._0_8_ = uVar1;
          auVar24._12_2_ = sVar37;
          auVar24._14_2_ = auVar19._6_2_;
          auVar23._12_4_ = auVar24._12_4_;
          auVar23._8_2_ = 0;
          auVar23._0_8_ = uVar1;
          auVar23._10_2_ = auVar19._4_2_;
          auVar22._10_6_ = auVar23._10_6_;
          auVar22._8_2_ = sVar36;
          auVar22._0_8_ = uVar1;
          auVar21._8_8_ = auVar22._8_8_;
          auVar21._6_2_ = auVar19._2_2_;
          auVar21._4_2_ = sVar35;
          auVar21._2_2_ = auVar19._0_2_;
          auVar19 = pmaddwd(auVar21,(undefined1  [16])*wt);
          auVar25._0_4_ = auVar19._0_4_ >> 4;
          auVar25._4_4_ = auVar19._4_4_ >> 4;
          auVar25._8_4_ = auVar19._8_4_ >> 4;
          auVar25._12_4_ = auVar19._12_4_ >> 4;
          auVar19 = packusdw(auVar25,auVar25);
        }
        auVar26._0_2_ = auVar19._0_2_ + (short)(*res_sub_const)[0] + (short)(*round_bits_const)[0];
        auVar26._2_2_ =
             auVar19._2_2_ + *(short *)((long)*res_sub_const + 2) +
             *(short *)((long)*round_bits_const + 2);
        auVar26._4_2_ =
             auVar19._4_2_ + *(short *)((long)*res_sub_const + 4) +
             *(short *)((long)*round_bits_const + 4);
        auVar26._6_2_ =
             auVar19._6_2_ + *(short *)((long)*res_sub_const + 6) +
             *(short *)((long)*round_bits_const + 6);
        auVar26._8_2_ = auVar19._8_2_ + (short)(*res_sub_const)[1] + (short)(*round_bits_const)[1];
        auVar26._10_2_ =
             auVar19._10_2_ + *(short *)((long)*res_sub_const + 10) +
             *(short *)((long)*round_bits_const + 10);
        auVar26._12_2_ =
             auVar19._12_2_ + *(short *)((long)*res_sub_const + 0xc) +
             *(short *)((long)*round_bits_const + 0xc);
        auVar26._14_2_ =
             auVar19._14_2_ + *(short *)((long)*res_sub_const + 0xe) +
             *(short *)((long)*round_bits_const + 0xe);
        auVar19 = psraw(auVar26,ZEXT416((uint)round_bits));
        sVar35 = auVar19._0_2_;
        sVar36 = auVar19._2_2_;
        sVar37 = auVar19._4_2_;
        sVar2 = auVar19._6_2_;
        *(uint *)(pred + (long)(iVar14 * p_stride + j) + 4) =
             CONCAT13((0 < sVar2) * (sVar2 < 0x100) * auVar19[6] - (0xff < sVar2),
                      CONCAT12((0 < sVar37) * (sVar37 < 0x100) * auVar19[4] - (0xff < sVar37),
                               CONCAT11((0 < sVar36) * (sVar36 < 0x100) * auVar19[2] -
                                        (0xff < sVar36),
                                        (0 < sVar35) * (sVar35 < 0x100) * auVar19[0] -
                                        (0xff < sVar35))));
      }
    }
  }
  return;
}

Assistant:

static inline void store_vertical_filter_output(
    __m128i *res_lo, __m128i *res_hi, const __m128i *res_add_const,
    const __m128i *wt, const __m128i *res_sub_const, __m128i *round_bits_const,
    uint8_t *pred, ConvolveParams *conv_params, int i, int j, int k,
    const int reduce_bits_vert, int p_stride, int p_width,
    const int round_bits) {
  __m128i res_lo_1 = *res_lo;
  __m128i res_hi_1 = *res_hi;

  if (conv_params->is_compound) {
    __m128i *const p =
        (__m128i *)&conv_params->dst[(i + k + 4) * conv_params->dst_stride + j];
    res_lo_1 = _mm_srai_epi32(_mm_add_epi32(res_lo_1, *res_add_const),
                              reduce_bits_vert);
    const __m128i temp_lo_16 = _mm_packus_epi32(res_lo_1, res_lo_1);
    __m128i res_lo_16;
    if (conv_params->do_average) {
      __m128i *const dst8 = (__m128i *)&pred[(i + k + 4) * p_stride + j];
      const __m128i p_16 = _mm_loadl_epi64(p);

      if (conv_params->use_dist_wtd_comp_avg) {
        const __m128i p_16_lo = _mm_unpacklo_epi16(p_16, temp_lo_16);
        const __m128i wt_res_lo = _mm_madd_epi16(p_16_lo, *wt);
        const __m128i shifted_32 =
            _mm_srai_epi32(wt_res_lo, DIST_PRECISION_BITS);
        res_lo_16 = _mm_packus_epi32(shifted_32, shifted_32);
      } else {
        res_lo_16 = _mm_srai_epi16(_mm_add_epi16(p_16, temp_lo_16), 1);
      }

      res_lo_16 = _mm_add_epi16(res_lo_16, *res_sub_const);

      res_lo_16 = _mm_srai_epi16(_mm_add_epi16(res_lo_16, *round_bits_const),
                                 round_bits);
      __m128i res_8_lo = _mm_packus_epi16(res_lo_16, res_lo_16);
      *(int *)dst8 = _mm_cvtsi128_si32(res_8_lo);
    } else {
      _mm_storel_epi64(p, temp_lo_16);
    }
    if (p_width > 4) {
      __m128i *const p4 =
          (__m128i *)&conv_params
              ->dst[(i + k + 4) * conv_params->dst_stride + j + 4];
      res_hi_1 = _mm_srai_epi32(_mm_add_epi32(res_hi_1, *res_add_const),
                                reduce_bits_vert);
      const __m128i temp_hi_16 = _mm_packus_epi32(res_hi_1, res_hi_1);
      __m128i res_hi_16;

      if (conv_params->do_average) {
        __m128i *const dst8_4 =
            (__m128i *)&pred[(i + k + 4) * p_stride + j + 4];
        const __m128i p4_16 = _mm_loadl_epi64(p4);

        if (conv_params->use_dist_wtd_comp_avg) {
          const __m128i p_16_hi = _mm_unpacklo_epi16(p4_16, temp_hi_16);
          const __m128i wt_res_hi = _mm_madd_epi16(p_16_hi, *wt);
          const __m128i shifted_32 =
              _mm_srai_epi32(wt_res_hi, DIST_PRECISION_BITS);
          res_hi_16 = _mm_packus_epi32(shifted_32, shifted_32);
        } else {
          res_hi_16 = _mm_srai_epi16(_mm_add_epi16(p4_16, temp_hi_16), 1);
        }
        res_hi_16 = _mm_add_epi16(res_hi_16, *res_sub_const);

        res_hi_16 = _mm_srai_epi16(_mm_add_epi16(res_hi_16, *round_bits_const),
                                   round_bits);
        __m128i res_8_hi = _mm_packus_epi16(res_hi_16, res_hi_16);
        *(int *)dst8_4 = _mm_cvtsi128_si32(res_8_hi);

      } else {
        _mm_storel_epi64(p4, temp_hi_16);
      }
    }
  } else {
    const __m128i res_lo_round = _mm_srai_epi32(
        _mm_add_epi32(res_lo_1, *res_add_const), reduce_bits_vert);
    const __m128i res_hi_round = _mm_srai_epi32(
        _mm_add_epi32(res_hi_1, *res_add_const), reduce_bits_vert);

    const __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
    __m128i res_8bit = _mm_packus_epi16(res_16bit, res_16bit);

    // Store, blending with 'pred' if needed
    __m128i *const p = (__m128i *)&pred[(i + k + 4) * p_stride + j];

    // Note: If we're outputting a 4x4 block, we need to be very careful
    // to only output 4 pixels at this point, to avoid encode/decode
    // mismatches when encoding with multiple threads.
    if (p_width == 4) {
      *(int *)p = _mm_cvtsi128_si32(res_8bit);
    } else {
      _mm_storel_epi64(p, res_8bit);
    }
  }
}